

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_arg * __thiscall
fmt::v7::detail::
get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,fmt::v7::basic_string_view<char>>
          (format_arg *__return_storage_ptr__,detail *this,
          basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx,
          basic_string_view<char> id)

{
  basic_string_view<char> name;
  error_handler local_9;
  
  name.size_ = id.data_;
  name.data_ = (char *)ctx;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  get<char>(__return_storage_ptr__,
            (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             *)(this + 8),name);
  if (__return_storage_ptr__->type_ != none_type) {
    return __return_storage_ptr__;
  }
  error_handler::on_error(&local_9,"argument not found");
}

Assistant:

FMT_CONSTEXPR typename Context::format_arg get_arg(Context& ctx, ID id) {
  auto arg = ctx.arg(id);
  if (!arg) ctx.on_error("argument not found");
  return arg;
}